

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivar.c
# Opt level: O2

void objc_compute_ivar_offsets(Class class)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Class poVar4;
  objc_ivar *poVar5;
  objc_class_gsv1 *poVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int i;
  objc_ivar_list *l;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  if (class->ivars == (objc_ivar_list *)0x0) {
    poVar4 = class_getSuperclass(class);
    if (poVar4 != (Class)0x0) {
      class->instance_size = poVar4->instance_size;
    }
  }
  else {
    if (class->ivars->size != 0x20) {
      fwrite("Downgrading ivar struct not yet implemented",0x2b,1,_stderr);
      abort();
    }
    if (class->instance_size < 1) {
      poVar4 = class_getSuperclass(class);
      if (poVar4 == (Class)0x0) {
        lVar11 = 0;
      }
      else {
        lVar11 = poVar4->instance_size;
        if (lVar11 < 1) {
          objc_compute_ivar_offsets(poVar4);
          lVar11 = poVar4->instance_size;
        }
      }
      class->instance_size = lVar11;
      l = class->ivars;
      if (l != (objc_ivar_list *)0x0) {
        uVar13 = 0;
        lVar12 = -1;
        lVar8 = -0x8000000000000000;
        for (i = 0; iVar3 = (int)lVar11, i < l->count; i = i + 1) {
          poVar5 = ivar_at_index(l,i);
          uVar2 = poVar5->size;
          if ((uVar2 == 0) && (uVar2 = 0, *poVar5->type == 'B')) {
            poVar5->size = 1;
            uVar2 = 1;
          }
          piVar1 = poVar5->offset;
          lVar10 = (long)*piVar1;
          if (lVar10 < (long)(lVar8 + uVar13)) {
            *piVar1 = ((int)lVar12 - (int)lVar8) + *piVar1;
            lVar10 = lVar8;
          }
          else {
            *piVar1 = iVar3;
            lVar12 = (long)iVar3;
            lVar11 = lVar11 + (ulong)uVar2;
            uVar13 = (ulong)poVar5->size;
            uVar7 = (ulong)(1 << ((byte)(poVar5->flags >> 3) & 0x1f));
            uVar9 = (lVar12 + 8U) % uVar7;
            if (uVar9 != 0) {
              lVar8 = uVar7 - uVar9;
              iVar3 = (int)lVar8 + iVar3;
              *piVar1 = iVar3;
              class->instance_size = class->instance_size + lVar8;
              lVar11 = lVar8 + lVar11;
              uVar7 = (ulong)(1 << ((byte)(poVar5->flags >> 3) & 0x1f));
            }
            if (((long)iVar3 + 8U) % uVar7 != 0) {
              __assert_fail("(*ivar->offset + sizeof(uintptr_t)) % ivarGetAlign(ivar) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/ivar.c"
                            ,0x6b,"void objc_compute_ivar_offsets(Class)");
            }
            class->instance_size = class->instance_size + (ulong)uVar2;
          }
          l = class->ivars;
          lVar8 = lVar10;
        }
        poVar6 = objc_legacy_class_for_class(class);
        if (poVar6 != (objc_class_gsv1 *)0x0) {
          lVar11 = 0x18;
          for (lVar12 = 0; lVar12 < class->ivars->count; lVar12 = lVar12 + 1) {
            poVar5 = ivar_at_index(class->ivars,(int)lVar12);
            *(int *)((long)&poVar6->ivars->count + lVar11) = *poVar5->offset;
            lVar11 = lVar11 + 0x18;
          }
        }
      }
    }
  }
  return;
}

Assistant:

PRIVATE void objc_compute_ivar_offsets(Class class)
{
	if (class->ivars == NULL)
	{
		Class super_class = class_getSuperclass(class);
		if (super_class != Nil)
		{
			class->instance_size = super_class->instance_size;
		}
		return;
	}
	if (class->ivars->size != sizeof(struct objc_ivar))
	{
		fprintf(stderr, "Downgrading ivar struct not yet implemented");
		abort();
	}
	int i = 0;
	/* If this class was compiled with support for late-bound ivars, the
	* instance_size field will contain 0 - {the size of the instance variables
	* declared for just this class}.  The individual instance variable offset
	* fields will then be the offsets from the start of the class, and so must
	* have the size of the parent class prepended. */
	if (class->instance_size <= 0)
	{
		Class super = class_getSuperclass(class);
		long ivar_start = 0;
		if (Nil != super)
		{
			if (super->instance_size <= 0)
			{
				objc_compute_ivar_offsets(super);
			}
			ivar_start = super->instance_size;
		}
		class->instance_size = ivar_start;
		/* For each instance variable, we add the offset if required (it will be zero
		* if this class is compiled with a static ivar layout).  We then set the
		* value of a global variable to the offset value.  
		*
		* Any class compiled with support for the non-fragile ABI, but not actually
		* using it, will export the ivar offset field as a symbol.
		*
		* Note that using non-fragile ivars breaks @defs().  If you need equivalent
		* functionality, provide an alternative @interface with all variables
		* declared @public.
		*/
		if (class->ivars)
		{
			// If the first instance variable had any alignment padding, then we need 
			// to discard it.  We will recompute padding ourself later.
			long next_ivar = ivar_start;
			long last_offset = LONG_MIN;
			long last_size = 0;
			long last_computed_offset = -1;
			size_t refcount_size = sizeof(uintptr_t);
			for (i = 0 ; i < class->ivars->count ; i++)
			{
				struct objc_ivar *ivar = ivar_at_index(class->ivars, i);
				// Clang 7 and 8 have a bug where the size of _Bool is encoded
				// as 0, not 1.  Silently fix this up when we see it.
				if (ivar->size == 0 && ivar->type[0] == 'B')
				{
					ivar->size = 1;
				}
				// We are going to be allocating an extra word for the reference count
				// in front of the object.  This doesn't matter for aligment most of
				// the time, but if we have an instance variable that is a vector type
				// then we will need to ensure that we are properly aligned again.
				long ivar_size = ivar->size;
				// Bitfields have the same offset - the base of the variable
				// that contains them.  If we are in a bitfield, then we need
				// to make sure that we don't add any displacement from the
				// previous value.
				if (*ivar->offset < last_offset + last_size)
				{
					*ivar->offset = last_computed_offset + (*ivar->offset - last_offset);
					ivar_size = 0;
					continue;
				}
				last_offset = *ivar->offset;
				*ivar->offset = next_ivar;
				last_computed_offset = *ivar->offset;
				next_ivar += ivar_size;
				last_size = ivar->size;
				size_t align = ivarGetAlign(ivar);
				if ((*ivar->offset + refcount_size) % align != 0)
				{
					long padding = align - ((*ivar->offset + refcount_size) % align); 
					*ivar->offset += padding;
					class->instance_size += padding;
					next_ivar += padding;
				}
				assert((*ivar->offset + sizeof(uintptr_t)) % ivarGetAlign(ivar) == 0);
				class->instance_size += ivar_size;
			}
#ifdef OLDABI_COMPAT
			// If we have a legacy ivar list, update the offset in it too -
			// code from older compilers may access this directly!
			struct objc_class_gsv1* legacy = objc_legacy_class_for_class(class);
			if (legacy)
			{
				for (i = 0 ; i < class->ivars->count ; i++)
				{
					legacy->ivars->ivar_list[i].offset = *ivar_at_index(class->ivars, i)->offset;
				}
			}
#endif
		}
	}
}